

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

void __thiscall FParser::SimpleEvaluate(FParser *this,svalue_t *returnvar,int n)

{
  tokentype_t tVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  DFsVariable *this_00;
  long lVar5;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  double dVar9;
  
  tVar1 = this->TokenType[n];
  if (tVar1 != name_) {
    if (tVar1 == number) {
      pcVar8 = this->Tokens[n];
      pcVar4 = strchr(pcVar8,0x2e);
      if (pcVar4 == (char *)0x0) {
        returnvar->type = 1;
        iVar2 = atoi(pcVar8);
        (returnvar->value).i = iVar2;
      }
      else {
        dVar9 = atof(pcVar8);
        (returnvar->value).i = (int)(dVar9 * 65536.0);
        returnvar->type = 6;
      }
    }
    else if (tVar1 == string_) {
      returnvar->type = 0;
      FString::operator=(&returnvar->string,this->Tokens[n]);
      return;
    }
    return;
  }
  this_00 = DFsScript::FindVariable(this->Script,this->Tokens[n]);
  if (this_00 != (DFsVariable *)0x0) {
    DFsVariable::GetValue(this_00,returnvar);
    return;
  }
  piVar7 = (int *)this->Tokens[n];
  pcVar8 = "unknown variable \'%s\'\n";
  script_error("unknown variable \'%s\'\n");
  lVar5 = (long)*piVar7;
  if (**(char **)(pcVar8 + lVar5 * 8 + 0x10) == '(') {
    while (iVar2 = *(int *)CONCAT44(extraout_var,extraout_EDX),
          **(char **)(pcVar8 + (long)iVar2 * 8 + 0x10) == ')') {
      iVar3 = (int)lVar5;
      if (iVar3 < iVar2) {
        lVar5 = 0;
        iVar6 = 0;
        do {
          if ((*(int *)(pcVar8 + lVar5 * 4 + (long)iVar3 * 4 + 0x810) == 2) &&
             (iVar6 = (iVar6 + (uint)(**(char **)(pcVar8 + lVar5 * 8 + (long)iVar3 * 8 + 0x10) ==
                                     '(')) -
                      (uint)(**(char **)(pcVar8 + lVar5 * 8 + (long)iVar3 * 8 + 0x10) == ')'),
             iVar6 == 0)) {
            return;
          }
          lVar5 = lVar5 + 1;
        } while (iVar2 - iVar3 != (int)lVar5);
      }
      *piVar7 = iVar3 + 1;
      *(int *)CONCAT44(extraout_var,extraout_EDX) = *(int *)CONCAT44(extraout_var,extraout_EDX) + -1
      ;
      lVar5 = (long)*piVar7;
      if (**(char **)(pcVar8 + lVar5 * 8 + 0x10) != '(') {
        return;
      }
    }
  }
  return;
}

Assistant:

void FParser::SimpleEvaluate(svalue_t &returnvar, int n)
{
	DFsVariable *var;
	
	switch(TokenType[n])
    {
    case string_: 
		returnvar.type = svt_string;
		returnvar.string = Tokens[n];
		break;
		
    case number:
		if(strchr(Tokens[n], '.'))
		{
			returnvar.setDouble(atof(Tokens[n]));
		}
		else
		{
			returnvar.type = svt_int;
			returnvar.value.i = atoi(Tokens[n]);
		}
		break;
		
    case name_:   
		var = Script->FindVariable(Tokens[n]);
		if(!var)
		{
			script_error("unknown variable '%s'\n", Tokens[n]);
		}
		else var->GetValue(returnvar);
		
    default: 
		break;
    }
}